

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::removeVertex(Graph *this,int idx)

{
  Node *pNVar1;
  bool bVar2;
  ostream *poVar3;
  const_iterator local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Self local_70;
  Node *local_68;
  _Self local_60;
  iterator iter;
  Node **node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_30;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_28;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_20;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> it;
  int idx_local;
  Graph *this_local;
  
  it._M_current._4_4_ = idx;
  local_28._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->adj_list);
  local_30._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->adj_list);
  __range1 = (vector<Node_*,_std::allocator<Node_*>_> *)getNode(this,it._M_current._4_4_);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,Node*>
                       (local_28,local_30,(Node **)&__range1);
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->adj_list);
  node = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->adj_list);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                     *)&node), bVar2) {
    iter._M_node = (_Base_ptr)
                   __gnu_cxx::
                   __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&__end1);
    pNVar1 = *(Node **)iter._M_node;
    local_68 = getNode(this,it._M_current._4_4_);
    local_60._M_node =
         (_Base_ptr)
         std::map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>::
         find(&pNVar1->edges,&local_68);
    local_70._M_node =
         (_Base_ptr)
         std::map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>::
         end((map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_> *)
             (*(long *)iter._M_node + 0x10));
    bVar2 = std::operator!=(&local_60,&local_70);
    if (bVar2) {
      local_78 = local_60._M_node;
      local_80 = (_Base_ptr)
                 std::map<Node*,int,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>::
                 erase_abi_cxx11_((map<Node*,int,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                                   *)(*(long *)iter._M_node + 0x10),local_60._M_node);
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
  __normal_iterator<Node**>
            ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_88,
             &local_20);
  std::vector<Node_*,_std::allocator<Node_*>_>::erase(&this->adj_list,local_88);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Removed Vertex ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,it._M_current._4_4_);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void Graph::removeVertex(int idx) {
    auto it = std::find(adj_list.begin(), adj_list.end(), getNode(idx));

    for(auto&node:adj_list){
        auto iter = node->edges.find(getNode(idx));
        if(iter!=node->edges.end())
            node->edges.erase(iter);
    }

    adj_list.erase(it);

    std::cerr<< "Removed Vertex " << idx<<'\n';
}